

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.h
# Opt level: O1

void __thiscall
lunasvg::SVGPatternAttributes::setDefaultValues
          (SVGPatternAttributes *this,SVGPatternElement *element)

{
  if (this->m_x == (SVGPatternElement *)0x0) {
    this->m_x = element;
  }
  if (this->m_y == (SVGPatternElement *)0x0) {
    this->m_y = element;
  }
  if (this->m_width == (SVGPatternElement *)0x0) {
    this->m_width = element;
  }
  if (this->m_height == (SVGPatternElement *)0x0) {
    this->m_height = element;
  }
  if (this->m_patternTransform == (SVGPatternElement *)0x0) {
    this->m_patternTransform = element;
  }
  if (this->m_patternUnits == (SVGPatternElement *)0x0) {
    this->m_patternUnits = element;
  }
  if (this->m_patternContentUnits == (SVGPatternElement *)0x0) {
    this->m_patternContentUnits = element;
  }
  if (this->m_viewBox == (SVGPatternElement *)0x0) {
    this->m_viewBox = element;
  }
  if (this->m_preserveAspectRatio == (SVGPatternElement *)0x0) {
    this->m_preserveAspectRatio = element;
  }
  if (this->m_patternContentElement != (SVGPatternElement *)0x0) {
    return;
  }
  this->m_patternContentElement = element;
  return;
}

Assistant:

void setDefaultValues(const SVGPatternElement* element) {
        if(!m_x) { m_x = element; }
        if(!m_y) { m_y = element; }
        if(!m_width) { m_width = element; }
        if(!m_height) { m_height = element; }
        if(!m_patternTransform) { m_patternTransform = element; }
        if(!m_patternUnits) { m_patternUnits = element; }
        if(!m_patternContentUnits) { m_patternContentUnits = element; }
        if(!m_viewBox) { m_viewBox = element; }
        if(!m_preserveAspectRatio) { m_preserveAspectRatio = element; }
        if(!m_patternContentElement) { m_patternContentElement = element; }
    }